

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_lump.cpp
# Opt level: O3

bool __thiscall FLumpFile::Open(FLumpFile *this,bool quiet)

{
  FUncompressedLump *pFVar1;
  char *in_RAX;
  undefined8 *puVar2;
  FString name;
  FString local_18;
  
  local_18.Chars = in_RAX;
  ExtractFileBase((char *)&local_18,
                  SUB81((this->super_FUncompressedFile).super_FResourceFile.Filename,0));
  puVar2 = (undefined8 *)operator_new__(0x58);
  *puVar2 = 1;
  puVar2[3] = 0x8a502c;
  *(undefined2 *)(puVar2 + 6) = 0;
  *(undefined1 *)(puVar2 + 4) = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  *(undefined8 *)((long)puVar2 + 0x44) = 0;
  *(undefined8 *)((long)puVar2 + 0x4c) = 0;
  puVar2[1] = &PTR__FResourceLump_0088bf20;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_FUncompressedFile).Lumps = (FUncompressedLump *)(puVar2 + 1);
  uppercopy((char *)(puVar2 + 4),local_18.Chars);
  (((this->super_FUncompressedFile).Lumps)->super_FResourceLump).field_3.Name[8] = '\0';
  pFVar1 = (this->super_FUncompressedFile).Lumps;
  (pFVar1->super_FResourceLump).Owner = (FResourceFile *)this;
  *(undefined4 *)&(pFVar1->super_FResourceLump).field_0x4c = 0;
  (pFVar1->super_FResourceLump).LumpSize =
       (int)((this->super_FUncompressedFile).super_FResourceFile.Reader)->Length;
  (pFVar1->super_FResourceLump).Namespace = 0;
  (pFVar1->super_FResourceLump).Flags = '\0';
  FString::operator=(&(pFVar1->super_FResourceLump).FullName,(char *)0x0);
  (this->super_FUncompressedFile).super_FResourceFile.NumLumps = 1;
  if (!quiet) {
    Printf("\n");
  }
  FString::~FString(&local_18);
  return true;
}

Assistant:

bool FLumpFile::Open(bool quiet)
{
	FString name(ExtractFileBase (Filename));

	Lumps = new FUncompressedLump[1];	// must use array allocator
	uppercopy(Lumps->Name, name);
	Lumps->Name[8] = 0;
	Lumps->Owner = this;
	Lumps->Position = 0;
	Lumps->LumpSize = Reader->GetLength();
	Lumps->Namespace = ns_global;
	Lumps->Flags = 0;
	Lumps->FullName = NULL;
	NumLumps = 1;
	if (!quiet)
	{
		Printf("\n");
	}
	return true;
}